

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testSize<int>(char *type)

{
  int iVar1;
  ostream *poVar2;
  char *in_RDI;
  Interval<int> b_1;
  int max;
  int min;
  Interval<int> b1;
  int p;
  Interval<int> b0;
  Interval<int> b;
  Interval<int> *in_stack_ffffffffffffffb8;
  Interval<int> local_40;
  int local_38 [3];
  Interval<int> local_2c;
  int local_24 [3];
  Interval<int> local_18 [2];
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"    size() for type ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Interval<int>::Interval((Interval<int> *)0x16e272);
  iVar1 = Imath_3_2::Interval<int>::size(in_stack_ffffffffffffffb8);
  if (iVar1 != 0) {
    __assert_fail("b.size () == T (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x1dc,"void (anonymous namespace)::testSize(const char *) [T = int]");
  }
  local_24[2] = 0xffffffff;
  local_24[1] = 1;
  Imath_3_2::Interval<int>::Interval(local_18,local_24 + 2,local_24 + 1);
  iVar1 = Imath_3_2::Interval<int>::size(in_stack_ffffffffffffffb8);
  if (iVar1 != 2) {
    __assert_fail("b0.size () == T (2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x1e4,"void (anonymous namespace)::testSize(const char *) [T = int]");
  }
  local_24[0] = 0x2a;
  local_38[2] = 0xffffffd6;
  Imath_3_2::Interval<int>::Interval(&local_2c,local_38 + 2,local_24);
  iVar1 = Imath_3_2::Interval<int>::size(in_stack_ffffffffffffffb8);
  if (iVar1 != local_24[0] * 2) {
    __assert_fail("b1.size () == p * T (2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x1e9,"void (anonymous namespace)::testSize(const char *) [T = int]");
  }
  local_38[1] = 0;
  local_38[0] = 1;
  Imath_3_2::Interval<int>::Interval(&local_40,local_38 + 1,local_38);
  iVar1 = Imath_3_2::Interval<int>::size(in_stack_ffffffffffffffb8);
  if (iVar1 == local_38[0]) {
    return;
  }
  __assert_fail("b.size () == max",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                ,0x1f5,"void (anonymous namespace)::testSize(const char *) [T = int]");
}

Assistant:

void
testSize (const char* type)
{
    cout << "    size() for type " << type << endl;

    //
    // Size of empty interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        assert (b.size () == T (0));
    }

    //
    // Size of non-empty, has-volume interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b0 (T (-1), T (1));
        assert (b0.size () == T (2));

        T p (42);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b1 (-p, p);
        assert (b1.size () == p * T (2));
    }

    //
    // Size of non-empty, no-volume interval.
    //
    {
        T min (0);
        T max (1);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b (min, max);

        assert (b.size () == max);
    }
}